

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

Header * __thiscall Imf_3_4::DeepScanLineInputFile::header(DeepScanLineInputFile *this)

{
  mutex *__mutex;
  element_type *peVar1;
  Header local_50;
  
  __mutex = &((this->_data).
              super___shared_ptr<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_mx;
  std::mutex::lock(__mutex);
  peVar1 = (this->_data).
           super___shared_ptr<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1->header_filled == false) {
    Context::header(&local_50,&this->_ctxt,peVar1->partNumber);
    Header::operator=(&((this->_data).
                        super___shared_ptr<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->header,&local_50);
    Header::~Header(&local_50);
    peVar1 = (this->_data).
             super___shared_ptr<Imf_3_4::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar1->header_filled = true;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return &peVar1->header;
}

Assistant:

const Header&
DeepScanLineInputFile::header () const
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif
    if (!_data->header_filled)
    {
        _data->header = _ctxt.header (_data->partNumber);
        _data->header_filled = true;
    }
    return _data->header;
}